

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitcoin-cli.cpp
# Opt level: O3

UniValue * __thiscall
NetinfoRequestHandler::PrepareRequest
          (UniValue *__return_storage_ptr__,NetinfoRequestHandler *this,string *method,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  UniValue val;
  UniValue val_00;
  bool bVar3;
  runtime_error *this_00;
  byte bVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_00;
  pointer extraout_RDX;
  pointer pbVar5;
  long in_FS_OFFSET;
  string_view str;
  uint8_t n;
  undefined8 in_stack_fffffffffffffe88;
  _Alloc_hider in_stack_fffffffffffffe90;
  size_type in_stack_fffffffffffffe98;
  undefined8 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea8 [56];
  UniValue local_120;
  string local_c8;
  UniValue local_a8;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined8 local_3f;
  undefined4 local_37;
  undefined2 local_33;
  char local_31;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pbVar5 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pbVar5 != (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    local_c8._M_dataplus._M_p = local_c8._M_dataplus._M_p & 0xffffffffffffff00;
    str._M_str = (pbVar5->_M_dataplus)._M_p;
    str._M_len = pbVar5->_M_string_length;
    args_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args;
    bVar3 = ParseUInt8(str,(uint8_t *)&local_c8);
    if (!bVar3) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      pbVar5 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish == pbVar5) {
        if (*(long *)(in_FS_OFFSET + 0x28) != local_30) goto LAB_0012ebdc;
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
        pbVar5 = extraout_RDX;
      }
      tinyformat::format<std::__cxx11::string>
                ((string *)&local_120,
                 (tinyformat *)
                 "invalid -netinfo argument: %s\nFor more information, run: bitcoin-cli -netinfo help"
                 ,(char *)pbVar5,args_00);
      std::runtime_error::runtime_error(this_00,(string *)&local_120);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_0012ebdc;
    }
    bVar4 = 4;
    if ((byte)local_c8._M_dataplus._M_p < 4) {
      bVar4 = (byte)local_c8._M_dataplus._M_p;
    }
    this->m_details_level = bVar4;
  }
  local_50 = &local_40;
  __return_storage_ptr__->typ = VARR;
  (__return_storage_ptr__->val)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->val).field_2;
  (__return_storage_ptr__->val).field_2._M_local_buf[0] = '\0';
  *(undefined8 *)((long)&(__return_storage_ptr__->val).field_2 + 1) = local_3f;
  *(undefined4 *)((long)&(__return_storage_ptr__->val).field_2 + 9) = local_37;
  *(undefined2 *)((long)&(__return_storage_ptr__->val).field_2 + 0xd) = local_33;
  (__return_storage_ptr__->val).field_2._M_local_buf[0xf] = local_31;
  (__return_storage_ptr__->val)._M_string_length = 0;
  local_48 = 0;
  local_40 = 0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  paVar2 = &local_c8.field_2;
  local_c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"getpeerinfo","");
  UniValue::UniValue<const_int_&,_int,_true>(&local_120,&ID_PEERINFO);
  JSONRPCRequestObj(&local_a8,&local_c8,&NullUniValue,&local_120);
  val.val._M_dataplus._M_p = in_stack_fffffffffffffe90._M_p;
  val.typ = (VType)in_stack_fffffffffffffe88;
  val._4_4_ = SUB84(in_stack_fffffffffffffe88,4);
  val.val._M_string_length = in_stack_fffffffffffffe98;
  val.val.field_2._M_allocated_capacity = in_stack_fffffffffffffea0;
  val._32_56_ = in_stack_fffffffffffffea8;
  UniValue::push_back(__return_storage_ptr__,val);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_a8.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.val._M_dataplus._M_p != &local_a8.val.field_2) {
    operator_delete(local_a8.val._M_dataplus._M_p,local_a8.val.field_2._M_allocated_capacity + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_120.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_120.keys);
  paVar1 = &local_120.val.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120.val._M_dataplus._M_p != paVar1) {
    operator_delete(local_120.val._M_dataplus._M_p,local_120.val.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  local_c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"getnetworkinfo","");
  UniValue::UniValue<const_int_&,_int,_true>(&local_120,&ID_NETWORKINFO);
  JSONRPCRequestObj((UniValue *)&stack0xfffffffffffffe88,&local_c8,&NullUniValue,&local_120);
  val_00.val._M_dataplus._M_p = in_stack_fffffffffffffe90._M_p;
  val_00.typ = (VType)in_stack_fffffffffffffe88;
  val_00._4_4_ = SUB84(in_stack_fffffffffffffe88,4);
  val_00.val._M_string_length = in_stack_fffffffffffffe98;
  val_00.val.field_2._M_allocated_capacity = in_stack_fffffffffffffea0;
  val_00._32_56_ = in_stack_fffffffffffffea8;
  UniValue::push_back(__return_storage_ptr__,val_00);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)&stack0xfffffffffffffec8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&stack0xfffffffffffffeb0);
  if (in_stack_fffffffffffffe90._M_p != &stack0xfffffffffffffea0) {
    operator_delete(in_stack_fffffffffffffe90._M_p,in_stack_fffffffffffffea0 + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_120.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_120.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120.val._M_dataplus._M_p != paVar1) {
    operator_delete(local_120.val._M_dataplus._M_p,local_120.val.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
LAB_0012ebdc:
  __stack_chk_fail();
}

Assistant:

UniValue PrepareRequest(const std::string& method, const std::vector<std::string>& args) override
    {
        if (!args.empty()) {
            uint8_t n{0};
            if (ParseUInt8(args.at(0), &n)) {
                m_details_level = std::min(n, MAX_DETAIL_LEVEL);
            } else {
                throw std::runtime_error(strprintf("invalid -netinfo argument: %s\nFor more information, run: bitcoin-cli -netinfo help", args.at(0)));
            }
        }
        UniValue result(UniValue::VARR);
        result.push_back(JSONRPCRequestObj("getpeerinfo", NullUniValue, ID_PEERINFO));
        result.push_back(JSONRPCRequestObj("getnetworkinfo", NullUniValue, ID_NETWORKINFO));
        return result;
    }